

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

Abc_Ntk_t * Abc_SclUnBufferPhase(Abc_Ntk_t *pNtk,int fVerbose)

{
  Abc_Obj_t *pNode;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFanin;
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *__s;
  Vec_Ptr_t *pVVar4;
  Abc_Ntk_t *pNtk_00;
  int iVar5;
  char *__assertion;
  long lVar6;
  long lVar7;
  double dVar8;
  int local_3c;
  
  if (pNtk->vPhases != (Vec_Int_t *)0x0) {
    __assert_fail("pNtk->vPhases == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                  ,0xf4,"Abc_Ntk_t *Abc_SclUnBufferPhase(Abc_Ntk_t *, int)");
  }
  iVar5 = pNtk->vObjs->nSize;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar2 = iVar5;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar2;
  if (iVar2 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar2 << 2);
  }
  pVVar3->pArray = __s;
  pVVar3->nSize = iVar5;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)iVar5 << 2);
  }
  pNtk->vPhases = pVVar3;
  pVVar4 = pNtk->vObjs;
  if (pVVar4->nSize < 1) {
    dVar8 = 0.0;
    local_3c = 0;
  }
  else {
    lVar7 = 0;
    iVar5 = 0;
    local_3c = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar4->pArray[lVar7];
      if ((pNode != (Abc_Obj_t *)0x0) &&
         (((uVar1 = *(uint *)&pNode->field_0x14 & 0xf, uVar1 - 3 < 2 ||
           ((uVar1 == 7 && ((pNode->vFanins).nSize != 1)))) && (0 < (pNode->vFanins).nSize)))) {
        lVar6 = 0;
        do {
          pObj = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar6]];
          uVar1 = Abc_SclGetRealFaninLit(pObj);
          if (pNtk->vObjs->nSize <= (int)(uVar1 >> 1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pFanin = (Abc_Obj_t *)pNtk->vObjs->pArray[uVar1 >> 1];
          if (((pFanin != pObj) && (iVar2 = Abc_NodeFindFanin(pNode,pFanin), iVar2 < 0)) &&
             (Abc_ObjPatchFanin(pNode,pObj,pFanin), (uVar1 & 1) != 0)) {
            pVVar3 = pNode->pNtk->vPhases;
            if (pVVar3 == (Vec_Int_t *)0x0) {
              __assertion = "p->pNtk->vPhases";
LAB_004523c1:
              __assert_fail(__assertion,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                            ,0x18b,"void Abc_ObjFaninFlipPhase(Abc_Obj_t *, int)");
            }
            if ((pNode->vFanins).nSize <= lVar6) {
              __assertion = "i >= 0 && i < Abc_ObjFaninNum(p)";
              goto LAB_004523c1;
            }
            iVar2 = pNode->Id;
            if (((long)iVar2 < 0) || (pVVar3->nSize <= iVar2)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
            }
            pVVar3->pArray[iVar2] = pVVar3->pArray[iVar2] ^ 1 << ((byte)lVar6 & 0x1f);
            local_3c = local_3c + 1;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < (pNode->vFanins).nSize);
        iVar5 = iVar5 + (int)lVar6;
      }
      lVar7 = lVar7 + 1;
      pVVar4 = pNtk->vObjs;
    } while (lVar7 < pVVar4->nSize);
    dVar8 = (double)iVar5;
  }
  if (fVerbose != 0) {
    printf("Saved %d (%.2f %%) fanin phase bits.  ",((double)local_3c * 100.0) / dVar8);
  }
  pNtk_00 = Abc_NtkDupDfs(pNtk);
  if (fVerbose != 0) {
    uVar1 = Abc_SclCountMaxPhases(pNtk_00);
    printf("Max depth = %d.\n",(ulong)uVar1);
  }
  Abc_SclReportDupFanins(pNtk_00);
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_SclUnBufferPhase( Abc_Ntk_t * pNtk, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pFanin, * pFaninNew;
    int i, k, iLit, Counter = 0, Total = 0;
    assert( pNtk->vPhases == NULL );
    pNtk->vPhases = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNodeCo( pNtk, pObj, i )
    {
        if ( Abc_SclObjIsBufInv(pObj) )
            continue;
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            Total++;
            iLit = Abc_SclGetRealFaninLit( pFanin );
            pFaninNew = Abc_NtkObj( pNtk, Abc_Lit2Var(iLit) );
            if ( pFaninNew == pFanin )
                continue;
            // skip fanins which are already fanins of the node
            if ( Abc_NodeFindFanin( pObj, pFaninNew ) >= 0 )
                continue;
            Abc_ObjPatchFanin( pObj, pFanin, pFaninNew );
            if ( Abc_LitIsCompl(iLit) )
                Abc_ObjFaninFlipPhase( pObj, k ), Counter++;
        }
    }
    if ( fVerbose )
        printf( "Saved %d (%.2f %%) fanin phase bits.  ", Counter, 100.0 * Counter / Total );
    // duplicate network in topo order
    pNtkNew = Abc_NtkDupDfs( pNtk );
    if ( fVerbose )
        printf( "Max depth = %d.\n", Abc_SclCountMaxPhases(pNtkNew) );
    Abc_SclReportDupFanins( pNtkNew );
    return pNtkNew;
}